

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O1

int __thiscall amrex::AMRErrorTag::SetNGrow(AMRErrorTag *this)

{
  int iVar1;
  mapped_type_conflict1 *pmVar2;
  initializer_list<std::pair<const_amrex::AMRErrorTag::TEST,_int>_> __l;
  allocator_type local_3a;
  less<amrex::AMRErrorTag::TEST> local_39;
  pair<const_amrex::AMRErrorTag::TEST,_int> local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (this->m_test == USER) {
    Assert_host("m_test != USER",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/AmrCore/AMReX_ErrorList.cpp"
                ,0xeb,"\"Do not call SetNGrow with USER test\"");
  }
  if (SetNGrow()::ng == '\0') {
    iVar1 = __cxa_guard_acquire(&SetNGrow()::ng);
    if (iVar1 != 0) {
      local_18 = 4;
      uStack_10 = 5;
      local_28 = 2;
      uStack_20 = 3;
      local_38.first = GRAD;
      local_38.second = 1;
      uStack_30 = 0x100000001;
      __l._M_len = 6;
      __l._M_array = &local_38;
      std::
      map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
      ::map(&SetNGrow::ng,__l,&local_39,&local_3a);
      __cxa_atexit(std::
                   map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
                   ::~map,&SetNGrow::ng,&__dso_handle);
      __cxa_guard_release(&SetNGrow()::ng);
    }
  }
  pmVar2 = std::
           map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
           ::operator[](&SetNGrow::ng,&this->m_test);
  return *pmVar2;
}

Assistant:

int
AMRErrorTag::SetNGrow () const noexcept
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_test != USER, "Do not call SetNGrow with USER test");
    static std::map<TEST,int> ng = { {GRAD,1}, {RELGRAD,1}, {LESS,0}, {GREATER,0}, {VORT,0}, {BOX,0} };
    return ng[m_test];
}